

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O3

KBOOL __thiscall KDIS::DATA_TYPE::RecordSet::operator==(RecordSet *this,RecordSet *Value)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  if ((((this->m_ui32RecID == Value->m_ui32RecID) &&
       (this->m_ui32RecSetSerialNum == Value->m_ui32RecSetSerialNum)) &&
      (this->m_ui16RecLen == Value->m_ui16RecLen)) && (this->m_ui16RecCnt == Value->m_ui16RecCnt)) {
    __s1 = (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    __s2 = (Value->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    if (__n == (long)(Value->m_vui8RecVals).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__s2) {
      if (puVar1 == __s1) {
        return true;
      }
      iVar2 = bcmp(__s1,__s2,__n);
      if (iVar2 == 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

KBOOL RecordSet::operator == ( const RecordSet & Value ) const
{
    if( m_ui32RecID           != Value.m_ui32RecID )            return false;
    if( m_ui32RecSetSerialNum != Value.m_ui32RecSetSerialNum )  return false;
    if( m_ui16RecLen          != Value.m_ui16RecLen )           return false;
    if( m_ui16RecCnt          != Value.m_ui16RecCnt )           return false;
    if( m_vui8RecVals         != Value.m_vui8RecVals )          return false;
    return true;
}